

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

int __thiscall Fl_Input_::up_down_position(Fl_Input_ *this,int i,int keepmark)

{
  int iVar1;
  char *pcVar2;
  char *p;
  int p_00;
  char *pcVar3;
  char *e;
  double dVar4;
  char buf [1024];
  char local_438 [1032];
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)this->textfont_,(ulong)(uint)this->textsize_);
  p = this->value_ + i;
  pcVar2 = expand(this,p,local_438);
  pcVar3 = p;
  e = p;
  if (p < pcVar2) {
    do {
      e = pcVar3 + ((long)(pcVar2 + (-((long)(pcVar2 + (1 - (long)pcVar3)) >> 0x3f) - (long)pcVar3)
                                    + 1) >> 1);
      dVar4 = expandpos(this,p,e,local_438,(int *)0x0);
      if (up_down_pos < (double)(int)dVar4) {
        pcVar2 = pcVar3 + ((long)(pcVar2 + (-((long)(pcVar2 + (1 - (long)pcVar3)) >> 0x3f) -
                                           (long)pcVar3) + 1) >> 1) + -1;
        e = pcVar3;
      }
      pcVar3 = e;
    } while (e < pcVar2);
  }
  p_00 = (int)e - *(int *)&this->value_;
  iVar1 = p_00;
  if (keepmark != 0) {
    iVar1 = this->mark_;
  }
  iVar1 = position(this,p_00,iVar1);
  was_up_down = 1;
  return iVar1;
}

Assistant:

int Fl_Input_::up_down_position(int i, int keepmark) {
  // unlike before, i must be at the start of the line already!

  setfont();
  char buf[MAXBUF];
  const char* p = value()+i;
  const char* e = expand(p, buf);
  const char *l, *r, *t;
  for (l = p, r = e; l<r; ) {
    t = l+(r-l+1)/2;
    int f = (int)expandpos(p, t, buf, 0);
    if (f <= up_down_pos) l = t; else r = t-1;
  }
  int j = (int) (l-value());
  j = position(j, keepmark ? mark_ : j);
  was_up_down = 1;
  return j;
}